

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunner.cpp
# Opt level: O3

configInfo * glcts::parseConfigBitsFromName(configInfo *__return_storage_ptr__,char *configName)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  undefined4 extraout_var;
  bool bVar9;
  
  lVar8 = 0;
  bVar5 = true;
  do {
    bVar9 = bVar5;
    pcVar2 = parseConfigBitsFromName::colorCfgs[lVar8].name;
    sVar7 = strlen(pcVar2);
    iVar6 = strncmp(configName,pcVar2,sVar7);
    if (iVar6 == 0) {
      iVar6 = parseConfigBitsFromName::colorCfgs[lVar8].greenBits;
      iVar3 = parseConfigBitsFromName::colorCfgs[lVar8].blueBits;
      iVar4 = parseConfigBitsFromName::colorCfgs[lVar8].alphaBits;
      __return_storage_ptr__->redBits = parseConfigBitsFromName::colorCfgs[lVar8].redBits;
      __return_storage_ptr__->greenBits = iVar6;
      __return_storage_ptr__->blueBits = iVar3;
      __return_storage_ptr__->alphaBits = iVar4;
      configName = configName + sVar7;
      break;
    }
    lVar8 = 1;
    bVar5 = false;
  } while (bVar9);
  lVar8 = 0;
  bVar5 = true;
  do {
    bVar9 = bVar5;
    pcVar2 = parseConfigBitsFromName::depthCfgs[lVar8].name;
    sVar7 = strlen(pcVar2);
    iVar6 = strncmp(configName,pcVar2,sVar7);
    if (iVar6 == 0) {
      __return_storage_ptr__->depthBits = parseConfigBitsFromName::depthCfgs[lVar8].depthBits;
      configName = configName + sVar7;
      break;
    }
    lVar8 = 1;
    bVar5 = false;
  } while (bVar9);
  lVar8 = 0;
  bVar5 = true;
  do {
    bVar9 = bVar5;
    pcVar2 = parseConfigBitsFromName::stencilCfgs[lVar8].name;
    sVar7 = strlen(pcVar2);
    iVar6 = strncmp(configName,pcVar2,sVar7);
    if (iVar6 == 0) {
      __return_storage_ptr__->stencilBits = parseConfigBitsFromName::stencilCfgs[lVar8].stencilBits;
      configName = configName + sVar7;
      break;
    }
    lVar8 = 1;
    bVar5 = false;
  } while (bVar9);
  lVar8 = 0;
  bVar5 = true;
  do {
    bVar9 = bVar5;
    pcVar2 = parseConfigBitsFromName::multiSampleCfgs[lVar8].name;
    sVar7 = strlen(pcVar2);
    iVar6 = strncmp(configName,pcVar2,sVar7);
    if (iVar6 == 0) {
      uVar1 = parseConfigBitsFromName::multiSampleCfgs[lVar8].samples;
      __return_storage_ptr__->samples = uVar1;
      return (configInfo *)(ulong)uVar1;
    }
    lVar8 = 1;
    bVar5 = false;
  } while (bVar9);
  return (configInfo *)CONCAT44(extraout_var,iVar6);
}

Assistant:

static configInfo parseConfigBitsFromName(const char* configName)
{
	configInfo cfgInfo;
	static const struct
	{
		const char* name;
		int			redBits;
		int			greenBits;
		int			blueBits;
		int			alphaBits;
	} colorCfgs[] = {
		{ "rgba8888", 8, 8, 8, 8 }, { "rgb565", 5, 6, 5, 0 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorCfgs); ndx++)
	{
		if (!strncmp(configName, colorCfgs[ndx].name, strlen(colorCfgs[ndx].name)))
		{
			cfgInfo.redBits   = colorCfgs[ndx].redBits;
			cfgInfo.greenBits = colorCfgs[ndx].greenBits;
			cfgInfo.blueBits  = colorCfgs[ndx].blueBits;
			cfgInfo.alphaBits = colorCfgs[ndx].alphaBits;

			configName += strlen(colorCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			depthBits;
	} depthCfgs[] = {
		{ "d0", 0 }, { "d24", 24 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthCfgs); ndx++)
	{
		if (!strncmp(configName, depthCfgs[ndx].name, strlen(depthCfgs[ndx].name)))
		{
			cfgInfo.depthBits = depthCfgs[ndx].depthBits;

			configName += strlen(depthCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			stencilBits;
	} stencilCfgs[] = {
		{ "s0", 0 }, { "s8", 8 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilCfgs); ndx++)
	{
		if (!strncmp(configName, stencilCfgs[ndx].name, strlen(stencilCfgs[ndx].name)))
		{
			cfgInfo.stencilBits = stencilCfgs[ndx].stencilBits;

			configName += strlen(stencilCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			samples;
	} multiSampleCfgs[] = {
		{ "ms0", 0 }, { "ms4", 4 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(multiSampleCfgs); ndx++)
	{
		if (!strncmp(configName, multiSampleCfgs[ndx].name, strlen(multiSampleCfgs[ndx].name)))
		{
			cfgInfo.samples = multiSampleCfgs[ndx].samples;

			configName += strlen(multiSampleCfgs[ndx].name);
			break;
		}
	}

	return cfgInfo;
}